

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_search_path.cpp
# Opt level: O1

string * __thiscall
duckdb::CatalogSearchPath::GetDefaultSchema
          (string *__return_storage_ptr__,CatalogSearchPath *this,string *catalog)

{
  pointer pCVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  CatalogSearchEntry *path;
  pointer l1;
  bool bVar5;
  
  l1 = (this->paths).
       super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
       super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
       _M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (this->paths).
           super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
           super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = l1 == pCVar1;
  if (!bVar5) {
    do {
      iVar4 = ::std::__cxx11::string::compare((char *)l1);
      if (iVar4 == 0) {
        iVar4 = 3;
      }
      else {
        bVar3 = StringUtil::CIEquals(&l1->catalog,catalog);
        iVar4 = 0;
        if (bVar3) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar2 = (l1->schema)._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (l1->schema)._M_string_length)
          ;
          iVar4 = 1;
        }
      }
      if ((iVar4 != 3) && (iVar4 != 0)) {
        if (!bVar5) {
          return __return_storage_ptr__;
        }
        break;
      }
      l1 = l1 + 1;
      bVar5 = l1 == pCVar1;
    } while (!bVar5);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"main","");
  return __return_storage_ptr__;
}

Assistant:

string CatalogSearchPath::GetDefaultSchema(const string &catalog) const {
	for (auto &path : paths) {
		if (path.catalog == TEMP_CATALOG) {
			continue;
		}
		if (StringUtil::CIEquals(path.catalog, catalog)) {
			return path.schema;
		}
	}
	return DEFAULT_SCHEMA;
}